

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DocumentContextExtenderAdapter.h
# Opt level: O3

EStatusCode __thiscall
DocumentContextExtenderAdapter::OnBeforeMergePageFromPage
          (DocumentContextExtenderAdapter *this,PDFPage *inTargetPage,
          PDFDictionary *inPageObjectDictionary,ObjectsContext *inPDFWriterObjectContext,
          DocumentContext *inDocumentContext,PDFDocumentHandler *inPDFDocumentHandler)

{
  return eSuccess;
}

Assistant:

virtual PDFHummus::EStatusCode OnBeforeMergePageFromPage(
							PDFPage* inTargetPage,
							PDFDictionary* inPageObjectDictionary,
							ObjectsContext* inPDFWriterObjectContext,
							PDFHummus::DocumentContext* inDocumentContext,
							PDFDocumentHandler* inPDFDocumentHandler){
	  (void) inTargetPage;
	  (void) inPageObjectDictionary;
	  (void) inPDFWriterObjectContext;
	  (void) inDocumentContext;
	  (void) inPDFDocumentHandler;
	  return PDFHummus::eSuccess;}